

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O3

string * __thiscall
argvParser::generateMarkdownArgumentOverview_abi_cxx11_
          (string *__return_storage_ptr__,argvParser *this)

{
  uint __val;
  argument *paVar1;
  pointer pcVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
  *pvVar7;
  undefined8 *puVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  pointer ppaVar10;
  undefined8 uVar11;
  long *plVar12;
  size_type *psVar13;
  pointer ppsVar14;
  ulong uVar15;
  bool bVar16;
  pointer ppsVar17;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  ulong uVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string req;
  string __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  argvParser *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  char *local_50 [2];
  char local_40 [16];
  
  local_80 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
  local_b0 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  local_88 = this;
  std::operator+(&local_d0,"# ",&(this->super_argParserAdvancedConfiguration).applicationName);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_78 = &local_68;
  plVar12 = plVar6 + 2;
  if ((long *)*plVar6 == plVar12) {
    local_68 = *plVar12;
    lStack_60 = plVar6[3];
  }
  else {
    local_68 = *plVar12;
    local_78 = (long *)*plVar6;
  }
  local_70 = plVar6[1];
  *plVar6 = (long)plVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  paVar19 = &local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar19) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_78 = &local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"## Required arguments: \n","");
  pvVar7 = (local_88->super_argParserAdvancedConfiguration).newargconfig;
  ppsVar14 = (pvVar7->
             super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppsVar17 = (pvVar7->
             super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (ppsVar17 != ppsVar14) {
    uVar18 = 0;
    __return_storage_ptr___00 = &local_a8;
    bVar16 = false;
    do {
      if ((ulong)((long)ppsVar17 - (long)ppsVar14 >> 3) <= uVar18) {
LAB_00107e40:
        pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__throw_out_of_range_fmt
                           ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            ,uVar18);
        goto LAB_00107e51;
      }
      ppaVar10 = (ppsVar14[uVar18]->arguments->
                 super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      if ((ppsVar14[uVar18]->arguments->
          super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
          )._M_impl.super__Vector_impl_data._M_finish != ppaVar10) {
        uVar15 = 0;
        do {
          paVar1 = ppaVar10[uVar15];
          if (paVar1->requiredAndNotHitJet == true) {
            if (!bVar16) {
              std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_78);
            }
            std::operator+(__return_storage_ptr___00," * ",&paVar1->argLong);
            plVar6 = (long *)std::__cxx11::string::append((char *)__return_storage_ptr___00);
            psVar13 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_d0.field_2._M_allocated_capacity = *psVar13;
              local_d0.field_2._8_8_ = plVar6[3];
              local_d0._M_dataplus._M_p = (pointer)paVar19;
            }
            else {
              local_d0.field_2._M_allocated_capacity = *psVar13;
              local_d0._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_d0._M_string_length = plVar6[1];
            *plVar6 = (long)psVar13;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != paVar19) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p);
            }
            pvVar7 = (local_88->super_argParserAdvancedConfiguration).newargconfig;
            ppsVar14 = (pvVar7->
                       super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            bVar16 = true;
          }
          ppsVar17 = (pvVar7->
                     super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          if ((ulong)((long)ppsVar17 - (long)ppsVar14 >> 3) <= uVar18) goto LAB_00107e40;
          uVar15 = uVar15 + 1;
          ppaVar10 = (ppsVar14[uVar18]->arguments->
                     super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar15 < (ulong)((long)(ppsVar14[uVar18]->arguments->
                                        super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppaVar10
                                 >> 3));
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < (ulong)((long)ppsVar17 - (long)ppsVar14 >> 3));
  }
  std::__cxx11::string::append((char *)local_b0);
  pvVar7 = (local_88->super_argParserAdvancedConfiguration).newargconfig;
  ppsVar17 = (pvVar7->
             super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppsVar14 = (pvVar7->
             super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (ppsVar14 != ppsVar17) {
    __return_storage_ptr___00 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    do {
      if ((ppsVar17[(long)__return_storage_ptr___00]->sectionName)._M_string_length != 0) {
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)ppsVar14 - (long)ppsVar17 >> 3) <= __return_storage_ptr___00) goto LAB_00107e65;
        std::operator+(&local_a8,"### ",&ppsVar17[(long)__return_storage_ptr___00]->sectionName);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
        psVar13 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_d0.field_2._M_allocated_capacity = *psVar13;
          local_d0.field_2._8_8_ = puVar8[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar13;
          local_d0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_d0._M_string_length = puVar8[1];
        *puVar8 = psVar13;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        pvVar7 = (local_88->super_argParserAdvancedConfiguration).newargconfig;
        ppsVar17 = (pvVar7->
                   super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
      }
      ppsVar14 = (pvVar7->
                 super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)ppsVar14 - (long)ppsVar17 >> 3);
      if (pbVar9 <= __return_storage_ptr___00) goto LAB_00107e51;
      ppaVar10 = (ppsVar17[(long)__return_storage_ptr___00]->arguments->
                 super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      if ((ppsVar17[(long)__return_storage_ptr___00]->arguments->
          super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
          )._M_impl.super__Vector_impl_data._M_finish != ppaVar10) {
        uVar18 = 0;
        local_58 = __return_storage_ptr___00;
        do {
          paVar19 = &local_d0.field_2;
          paVar1 = ppaVar10[uVar18];
          std::operator+(&local_a8,"#### ",&paVar1->argLong);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
          psVar13 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_d0.field_2._M_allocated_capacity = *psVar13;
            local_d0.field_2._8_8_ = plVar6[3];
            local_d0._M_dataplus._M_p = (pointer)paVar19;
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar13;
            local_d0._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_d0._M_string_length = plVar6[1];
          *plVar6 = (long)psVar13;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar19) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
          pcVar2 = (paVar1->helpMessage)._M_dataplus._M_p;
          local_d0._M_dataplus._M_p = (pointer)paVar19;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,pcVar2,pcVar2 + (paVar1->helpMessage)._M_string_length);
          std::__cxx11::string::append((char *)&local_d0);
          std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar19) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          pcVar2 = (paVar1->additionalHelp)._M_dataplus._M_p;
          local_d0._M_dataplus._M_p = (pointer)paVar19;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,pcVar2,pcVar2 + (paVar1->additionalHelp)._M_string_length);
          std::__cxx11::string::append((char *)&local_d0);
          std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar19) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          std::operator+(&local_a8,"    short: ",&paVar1->argShort);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
          psVar13 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_d0.field_2._M_allocated_capacity = *psVar13;
            local_d0.field_2._8_8_ = plVar6[3];
            local_d0._M_dataplus._M_p = (pointer)paVar19;
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar13;
            local_d0._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_d0._M_string_length = plVar6[1];
          *plVar6 = (long)psVar13;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar19) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
          std::operator+(&local_a8,"    long : ",&paVar1->argLong);
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
          psVar13 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_d0.field_2._M_allocated_capacity = *psVar13;
            local_d0.field_2._8_8_ = puVar8[3];
            local_d0._M_dataplus._M_p = (pointer)paVar19;
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar13;
            local_d0._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_d0._M_string_length = puVar8[1];
          *puVar8 = psVar13;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar19) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
          __val = paVar1->numberOfArguments;
          if (0 < (int)__val) {
            __len = 1;
            if (9 < __val) {
              uVar4 = __val;
              uVar3 = 4;
              do {
                __len = uVar3;
                if (uVar4 < 100) {
                  __len = __len - 2;
                  goto LAB_00107b9a;
                }
                if (uVar4 < 1000) {
                  __len = __len - 1;
                  goto LAB_00107b9a;
                }
                if (uVar4 < 10000) goto LAB_00107b9a;
                bVar16 = 99999 < uVar4;
                uVar4 = uVar4 / 10000;
                uVar3 = __len + 4;
              } while (bVar16);
              __len = __len + 1;
            }
LAB_00107b9a:
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct((ulong)local_50,(char)__len);
            std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0],__len,__val);
            plVar6 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x10d257);
            __return_storage_ptr___00 = local_58;
            psVar13 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_a8.field_2._M_allocated_capacity = *psVar13;
              local_a8.field_2._8_8_ = plVar6[3];
              local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            }
            else {
              local_a8.field_2._M_allocated_capacity = *psVar13;
              local_a8._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_a8._M_string_length = plVar6[1];
            *plVar6 = (long)psVar13;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
            psVar13 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_d0.field_2._M_allocated_capacity = *psVar13;
              local_d0.field_2._8_8_ = puVar8[3];
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            }
            else {
              local_d0.field_2._M_allocated_capacity = *psVar13;
              local_d0._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_d0._M_string_length = puVar8[1];
            *puVar8 = psVar13;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p);
            }
            if (local_50[0] != local_40) {
              operator_delete(local_50[0]);
            }
          }
          iVar5 = std::__cxx11::string::compare((char *)&paVar1->enums);
          if (iVar5 != 0) {
            std::operator+(&local_a8,"allowed parameter: ",&paVar1->enums);
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
            psVar13 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_d0.field_2._M_allocated_capacity = *psVar13;
              local_d0.field_2._8_8_ = puVar8[3];
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            }
            else {
              local_d0.field_2._M_allocated_capacity = *psVar13;
              local_d0._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_d0._M_string_length = puVar8[1];
            *puVar8 = psVar13;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p);
            }
          }
          if (paVar1->requiredAndNotHitJet == true) {
            std::__cxx11::string::append((char *)local_b0);
          }
          pvVar7 = (local_88->super_argParserAdvancedConfiguration).newargconfig;
          ppsVar17 = (pvVar7->
                     super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          ppsVar14 = (pvVar7->
                     super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)ppsVar14 - (long)ppsVar17 >> 3);
          if (pbVar9 <= __return_storage_ptr___00) goto LAB_00107e51;
          uVar18 = uVar18 + 1;
          ppaVar10 = (ppsVar17[(long)__return_storage_ptr___00]->arguments->
                     super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar18 < (ulong)((long)(ppsVar17[(long)__return_storage_ptr___00]->arguments->
                                        super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppaVar10
                                 >> 3));
      }
      __return_storage_ptr___00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&(__return_storage_ptr___00->_M_dataplus)._M_p + 1);
    } while (__return_storage_ptr___00 <
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)ppsVar14 - (long)ppsVar17 >> 3));
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  return local_b0;
LAB_00107e51:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
             __return_storage_ptr___00,pbVar9);
LAB_00107e65:
  uVar11 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                      __return_storage_ptr___00);
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  pcVar2 = (local_b0->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != local_80) {
    operator_delete(pcVar2);
  }
  _Unwind_Resume(uVar11);
}

Assistant:

string argvParser::generateMarkdownArgumentOverview() {

  string md = "";

  md += "# "+ applicationName + "\n";
    string req =  "## Required arguments: \n";
    bool hasReq = false;

  for(int i = 0; i< newargconfig->size();i++) {
      for(int x = 0; x< newargconfig->at(i)->arguments->size();x++) {
          argument * arg = newargconfig->at(i)->arguments->at(x);
          if(arg->requiredAndNotHitJet){
              if(!hasReq){
                  hasReq = true;
                  md += req;
              }
              md += " * " +  arg->argLong + "\n";
          }
    }
  }
  md+= "## Application Arguments \n";
      for(int i = 0; i< newargconfig->size();i++) {
          if (!newargconfig->at(i)->sectionName.empty()) {
              md += "### " + newargconfig->at(i)->sectionName + "\n";
          }
          for (int x = 0; x < newargconfig->at(i)->arguments->size(); x++) {
              argument *arg = newargconfig->at(i)->arguments->at(x);
              md += "#### " + arg->argLong + "\n";
              md += arg->helpMessage + "\n\n";
              md += arg->additionalHelp + "\n\n";
              md += "    short: " + arg->argShort + " \n";
              md += "    long : " + arg->argLong + " \n\n";
              if (arg->numberOfArguments > 0)
                  md += "number of additional parameter: " + to_string(arg->numberOfArguments) + " \n \n ";
              if (arg->enums != "") {
                  md += "allowed parameter: " + arg->enums + "\n";
              }
              if (arg->requiredAndNotHitJet) {
                  md += "This argument is requires \n";
              }

          }
      }
    return md;
}